

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
               *this,GetterXsYs<int> *getter1,GetterXsYRef<int> *getter2,
              TransformerLogLog *transformer,ImU32 col)

{
  TransformerLogLog *pTVar1;
  int iVar2;
  ImVec2 IVar3;
  ImPlotPoint local_60;
  ImPlotPoint local_48;
  ImVec2 local_34;
  ImU32 local_2c;
  TransformerLogLog *pTStack_28;
  ImU32 col_local;
  TransformerLogLog *transformer_local;
  GetterXsYRef<int> *getter2_local;
  GetterXsYs<int> *getter1_local;
  ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
  *this_local;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  local_2c = col;
  pTStack_28 = transformer;
  transformer_local = (TransformerLogLog *)getter2;
  getter2_local = (GetterXsYRef<int> *)getter1;
  getter1_local = (GetterXsYs<int> *)this;
  iVar2 = ImMin<int>(this->Getter1->Count,this->Getter2->Count);
  this->Prims = iVar2 + -1;
  this->Col = local_2c;
  ImVec2::ImVec2(&this->P11);
  ImVec2::ImVec2(&this->P12);
  pTVar1 = this->Transformer;
  local_48 = GetterXsYs<int>::operator()(this->Getter1,0);
  local_34 = TransformerLogLog::operator()(pTVar1,&local_48);
  this->P11 = local_34;
  pTVar1 = this->Transformer;
  local_60 = GetterXsYRef<int>::operator()(this->Getter2,0);
  IVar3 = TransformerLogLog::operator()(pTVar1,&local_60);
  this->P12 = IVar3;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }